

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::PReLUParameter::SharedCtor(PReLUParameter *this)

{
  PReLUParameter *this_local;
  
  this->_cached_size_ = 0;
  memset(&this->filler_,0,9);
  return;
}

Assistant:

void PReLUParameter::SharedCtor() {
  _cached_size_ = 0;
  ::memset(&filler_, 0, reinterpret_cast<char*>(&channel_shared_) -
    reinterpret_cast<char*>(&filler_) + sizeof(channel_shared_));
}